

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall CSourceFilesProcessor::Error(CSourceFilesProcessor *this,CError *error)

{
  string *psVar1;
  ostream *poVar2;
  
  psVar1 = Refal2::CError::UserMessage_abi_cxx11_(error);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (error->severity == ES_FatalError) {
    std::ios::clear((int)this + 0x1f98 + (int)*(undefined8 *)(*(long *)&this->file + -0x18));
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x14a288);
    return;
  }
  return;
}

Assistant:

void CSourceFilesProcessor::Error( const CError& error )
{
	std::cerr << error.UserMessage() << std::endl;
	if( error.Severity() == ES_FatalError ) {
		file.clear( std::ios_base::eofbit );
		std::cin.clear( std::ios_base::eofbit );
	}
}